

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_perf.c
# Opt level: O1

double INT_CMprobe_bandwidth(CMConnection conn,long size,attr_list attrs)

{
  FILE *pFVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  __pid_t _Var6;
  char *pcVar7;
  pthread_t pVar8;
  size_t size_00;
  ulong uVar9;
  double dVar10;
  double secs_to_receive;
  FFSEncodeVec tmp_vec [1];
  timespec ts_1;
  double local_60;
  FFSEncodeVec local_58;
  timespec local_40;
  
  auVar2 = (ZEXT816(0) << 0x40 | ZEXT816(100000)) / SEXT816(size);
  iVar3 = INT_CMCondition_get(conn->cm,conn);
  size_00 = 0x18;
  if (0x18 < size) {
    size_00 = size;
  }
  uVar9 = 10;
  if (10 < auVar2._0_4_) {
    uVar9 = auVar2._0_8_ & 0xffffffff;
  }
  if (INT_CMprobe_bandwidth::max_block_size == 0) {
    pcVar7 = (char *)INT_CMmalloc(size_00);
  }
  else {
    if ((long)size_00 <= INT_CMprobe_bandwidth::max_block_size) goto LAB_0012567b;
    pcVar7 = (char *)INT_CMrealloc(INT_CMprobe_bandwidth::block,size_00);
  }
  if (pcVar7 == (char *)0x0) {
    return -1.0;
  }
  INT_CMprobe_bandwidth::max_block_size = size_00;
  INT_CMprobe_bandwidth::block = pcVar7;
  memset(pcVar7,0xef,size_00);
LAB_0012567b:
  pcVar7 = INT_CMprobe_bandwidth::block;
  pcVar7[0] = '\0';
  pcVar7[1] = 'P';
  pcVar7[2] = 'M';
  pcVar7[3] = 'C';
  *(uint *)(pcVar7 + 4) = (uint)(size_00 >> 0x20) & 0xffffff | 0xf2000000;
  *(int *)(pcVar7 + 8) = (int)size_00;
  *(int *)(pcVar7 + 0xc) = iVar3;
  INT_CMCondition_set_client_data(conn->cm,iVar3,&local_60);
  iVar4 = CMtrace_val[5];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar4 = CMtrace_init(conn->cm,CMTransportVerbose);
  }
  if (iVar4 != 0) {
    if (CMtrace_PID != 0) {
      pFVar1 = (FILE *)conn->cm->CMTrace_file;
      _Var6 = getpid();
      pVar8 = pthread_self();
      fprintf(pFVar1,"P%lxT%lx - ",(long)_Var6,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&local_58);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_58.iov_base,local_58.iov_len);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,
            "CM - Initiating bandwidth probe of %ld bytes, %d messages\n",size_00,uVar9);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  local_58.iov_base = INT_CMprobe_bandwidth::block;
  local_58.iov_len = size_00;
  iVar4 = INT_CMwrite_raw(conn,&local_58,(FFSEncodeVector)0x0,1,size_00,(attr_list)0x0,0);
  dVar10 = -1.0;
  if (iVar4 == 1) {
    INT_CMprobe_bandwidth::block[7] = -0xd;
    iVar4 = (int)uVar9 + -1;
    do {
      iVar5 = INT_CMwrite_raw(conn,&local_58,(FFSEncodeVector)0x0,1,size_00,(attr_list)0x0,0);
      if (iVar5 != 1) {
        return -1.0;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    INT_CMprobe_bandwidth::block[7] = -0xc;
    iVar4 = INT_CMwrite_raw(conn,&local_58,(FFSEncodeVector)0x0,1,size_00,(attr_list)0x0,0);
    dVar10 = -1.0;
    if (iVar4 == 1) {
      INT_CMCondition_wait(conn->cm,iVar3);
      iVar3 = CMtrace_val[5];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(conn->cm,CMTransportVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)conn->cm->CMTrace_file;
          _Var6 = getpid();
          pVar8 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var6,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)conn->cm->CMTrace_file,
                "CM - Completed bandwidth probe - result %g seconds\n",local_60);
      }
      fflush((FILE *)conn->cm->CMTrace_file);
      dVar10 = ((double)(int)uVar9 * (double)(long)size_00) / local_60;
      iVar3 = CMtrace_val[5];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(conn->cm,CMTransportVerbose);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar1 = (FILE *)conn->cm->CMTrace_file;
          _Var6 = getpid();
          pVar8 = pthread_self();
          fprintf(pFVar1,"P%lxT%lx - ",(long)_Var6,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_40);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
        }
        fprintf((FILE *)conn->cm->CMTrace_file,"CM - Estimated bandwidth - %g Mbites/sec\n",
                (dVar10 / 1000.0) * 1000.0 * 8.0);
      }
      fflush((FILE *)conn->cm->CMTrace_file);
    }
  }
  return dVar10;
}

Assistant:

extern double
INT_CMprobe_bandwidth(CMConnection conn, long size, attr_list attrs)
{
    int i;
    int cond;
    int repeat_count = 100000/size;  /* send about 100K */
    static long max_block_size = 0;
    static char *block = NULL;
    double secs_to_receive;
    long actual;
    double bandwidth;
    struct FFSEncodeVec tmp_vec[1];


    cond = INT_CMCondition_get(conn->cm, conn);

    if (size < 24) size = 24;
    if (repeat_count < 10) repeat_count = 10;
    if (max_block_size == 0) {
	char *new_block = malloc(size);
	if (new_block == NULL) return -1;
	block = new_block;
	max_block_size = size;
	memset(block, 0xef, size);
    } else if (size > max_block_size) {
	char *new_block = realloc(block, size);
	if (new_block == NULL) return -1;
	block = new_block;
	max_block_size = size;
	memset(block, 0xef, size);
    }
    
    /* CMP\0 in first entry for CMPerformance message */
    ((int*)block)[0] = 0x434d5000;
    /* size in second entry, high byte gives CMPerf operation */
#if SIZEOF_LONG == 4
    ((int*)block)[1] = 0 | (CMPerfBandwidthInit<<24);
    ((int*)block)[2] = size;
#else
    ((int*)block)[1] = ((size >> 32) &0xffffff) | (CMPerfBandwidthInit<<24);
    ((int*)block)[2] = (size & 0xffffffff);
#endif
    ((int*)block)[3] = cond;   /* condition value in third entry */
    
    INT_CMCondition_set_client_data( conn->cm, cond, &secs_to_receive);

    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Initiating bandwidth probe of %ld bytes, %d messages\n", size, repeat_count);
    tmp_vec[0].iov_base = &block[0];
    tmp_vec[0].iov_len = size;
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, size, NULL, 0);
    if (actual != 1) { 
	return -1;
    }

    ((int*)block)[1] = (((int*)block)[1]&0xffffff) | (CMPerfBandwidthBody<<24);
    for (i=0; i <(repeat_count-1); i++) {
	actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, size, NULL, 0);
	if (actual != 1) {
	    return -1;
	}
    }

    ((int*)block)[1] = (((int*)block)[1]&0xffffff) | (CMPerfBandwidthEnd<<24);
    actual = INT_CMwrite_raw(conn, tmp_vec, NULL, 1, size, NULL, 0);
    if (actual != 1) {
	return -1;
    }

    INT_CMCondition_wait(conn->cm, cond);
    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Completed bandwidth probe - result %g seconds\n", secs_to_receive);
    bandwidth = ((double) size * (double)repeat_count) / secs_to_receive;
    CMtrace_out(conn->cm, CMTransportVerbose, "CM - Estimated bandwidth - %g Mbites/sec\n", bandwidth / 1000.0 * 1000.0 * 8);
    return  bandwidth;
}